

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

uchar * sqlite3_serialize(sqlite3 *db,char *zSchema,sqlite3_int64 *piSize,uint mFlags)

{
  MemStore *pMVar1;
  Btree *pBVar2;
  Pager *pPVar3;
  sqlite3_stmt *pStmt_00;
  uint uVar4;
  int iVar5;
  int iVar6;
  MemFile *pMVar7;
  char *zSql;
  sqlite3_int64 sVar8;
  void *__dest;
  uchar *puVar9;
  size_t __n;
  ulong uVar10;
  u64 uVar11;
  uchar *__dest_00;
  long in_FS_OFFSET;
  DbPage *pPage;
  sqlite3_stmt *pStmt;
  DbPage *local_48;
  sqlite3_stmt *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_40 = (sqlite3_stmt *)0x0;
  if (zSchema == (char *)0x0) {
    zSchema = db->aDb->zDbSName;
  }
  pMVar7 = memdbFromDbSchema(db,zSchema);
  uVar4 = sqlite3FindDbName(db,zSchema);
  if (piSize != (sqlite3_int64 *)0x0) {
    *piSize = -1;
  }
  if ((int)uVar4 < 0) {
LAB_001218f2:
    puVar9 = (uchar *)0x0;
  }
  else {
    if (pMVar7 == (MemFile *)0x0) {
      pBVar2 = db->aDb[uVar4].pBt;
      if (pBVar2 != (Btree *)0x0) {
        __n = (size_t)(int)pBVar2->pBt->pageSize;
        zSql = sqlite3_mprintf("PRAGMA \"%w\".page_count",zSchema);
        if (zSql != (char *)0x0) {
          puVar9 = (uchar *)0x0;
          iVar5 = sqlite3LockAndPrepare(db,zSql,-1,0x80,(Vdbe *)0x0,&local_40,(char **)0x0);
          sqlite3_free(zSql);
          pStmt_00 = local_40;
          if (iVar5 != 0) goto LAB_001218f5;
          iVar5 = sqlite3_step(local_40);
          if (iVar5 == 100) {
            sVar8 = sqlite3_column_int64(pStmt_00,0);
            uVar11 = sVar8 * __n;
            if (uVar11 == 0) {
              sqlite3_reset(pStmt_00);
              uVar11 = 0;
              sqlite3_exec(db,"BEGIN IMMEDIATE; COMMIT;",(sqlite3_callback)0x0,(void *)0x0,
                           (char **)0x0);
              iVar5 = sqlite3_step(pStmt_00);
              if (iVar5 == 100) {
                sVar8 = sqlite3_column_int64(pStmt_00,0);
                uVar11 = sVar8 * __n;
              }
            }
            if (piSize != (sqlite3_int64 *)0x0) {
              *piSize = uVar11;
            }
            if ((mFlags & 1) == 0) {
              iVar5 = sqlite3_initialize();
              if (iVar5 == 0) {
                puVar9 = (uchar *)sqlite3Malloc(uVar11);
              }
              else {
                puVar9 = (uchar *)0x0;
              }
              if (puVar9 != (uchar *)0x0) {
                iVar5 = sqlite3_column_int(pStmt_00,0);
                if (0 < iVar5) {
                  pPVar3 = pBVar2->pBt->pPager;
                  uVar10 = 1;
                  __dest_00 = puVar9;
                  do {
                    local_48 = (DbPage *)0x0;
                    iVar6 = (*pPVar3->xGet)(pPVar3,(Pgno)uVar10,&local_48,0);
                    if (iVar6 == 0) {
                      memcpy(__dest_00,local_48->pData,__n);
                    }
                    else {
                      memset(__dest_00,0,__n);
                    }
                    if (local_48 != (DbPage *)0x0) {
                      sqlite3PagerUnrefNotNull(local_48);
                    }
                    uVar10 = uVar10 + 1;
                    __dest_00 = __dest_00 + __n;
                  } while (iVar5 + 1 != uVar10);
                }
                goto LAB_001219c8;
              }
            }
            puVar9 = (uchar *)0x0;
          }
          else {
            puVar9 = (uchar *)0x0;
          }
LAB_001219c8:
          sqlite3_finalize(pStmt_00);
          goto LAB_001218f5;
        }
        sqlite3_free((void *)0x0);
      }
      goto LAB_001218f2;
    }
    pMVar1 = pMVar7->pStore;
    if (piSize != (sqlite3_int64 *)0x0) {
      *piSize = pMVar1->sz;
    }
    if ((mFlags & 1) == 0) {
      uVar11 = pMVar1->sz;
      iVar5 = sqlite3_initialize();
      if (iVar5 == 0) {
        __dest = sqlite3Malloc(uVar11);
      }
      else {
        __dest = (void *)0x0;
      }
      if (__dest != (void *)0x0) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          puVar9 = (uchar *)memcpy(__dest,pMVar1->aData,pMVar1->sz);
          return puVar9;
        }
        goto LAB_001219d5;
      }
      goto LAB_001218f2;
    }
    puVar9 = pMVar1->aData;
  }
LAB_001218f5:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return puVar9;
  }
LAB_001219d5:
  __stack_chk_fail();
}

Assistant:

SQLITE_API unsigned char *sqlite3_serialize(
  sqlite3 *db,              /* The database connection */
  const char *zSchema,      /* Which database within the connection */
  sqlite3_int64 *piSize,    /* Write size here, if not NULL */
  unsigned int mFlags       /* Maybe SQLITE_SERIALIZE_NOCOPY */
){
  MemFile *p;
  int iDb;
  Btree *pBt;
  sqlite3_int64 sz;
  int szPage = 0;
  sqlite3_stmt *pStmt = 0;
  unsigned char *pOut;
  char *zSql;
  int rc;

#ifdef SQLITE_ENABLE_API_ARMOR
  if( !sqlite3SafetyCheckOk(db) ){
    (void)SQLITE_MISUSE_BKPT;
    return 0;
  }
#endif

  if( zSchema==0 ) zSchema = db->aDb[0].zDbSName;
  p = memdbFromDbSchema(db, zSchema);
  iDb = sqlite3FindDbName(db, zSchema);
  if( piSize ) *piSize = -1;
  if( iDb<0 ) return 0;
  if( p ){
    MemStore *pStore = p->pStore;
    assert( pStore->pMutex==0 );
    if( piSize ) *piSize = pStore->sz;
    if( mFlags & SQLITE_SERIALIZE_NOCOPY ){
      pOut = pStore->aData;
    }else{
      pOut = sqlite3_malloc64( pStore->sz );
      if( pOut ) memcpy(pOut, pStore->aData, pStore->sz);
    }
    return pOut;
  }
  pBt = db->aDb[iDb].pBt;
  if( pBt==0 ) return 0;
  szPage = sqlite3BtreeGetPageSize(pBt);
  zSql = sqlite3_mprintf("PRAGMA \"%w\".page_count", zSchema);
  rc = zSql ? sqlite3_prepare_v2(db, zSql, -1, &pStmt, 0) : SQLITE_NOMEM;
  sqlite3_free(zSql);
  if( rc ) return 0;
  rc = sqlite3_step(pStmt);
  if( rc!=SQLITE_ROW ){
    pOut = 0;
  }else{
    sz = sqlite3_column_int64(pStmt, 0)*szPage;
    if( sz==0 ){
      sqlite3_reset(pStmt);
      sqlite3_exec(db, "BEGIN IMMEDIATE; COMMIT;", 0, 0, 0);
      rc = sqlite3_step(pStmt);
      if( rc==SQLITE_ROW ){
        sz = sqlite3_column_int64(pStmt, 0)*szPage;
      }
    }
    if( piSize ) *piSize = sz;
    if( mFlags & SQLITE_SERIALIZE_NOCOPY ){
      pOut = 0;
    }else{
      pOut = sqlite3_malloc64( sz );
      if( pOut ){
        int nPage = sqlite3_column_int(pStmt, 0);
        Pager *pPager = sqlite3BtreePager(pBt);
        int pgno;
        for(pgno=1; pgno<=nPage; pgno++){
          DbPage *pPage = 0;
          unsigned char *pTo = pOut + szPage*(sqlite3_int64)(pgno-1);
          rc = sqlite3PagerGet(pPager, pgno, (DbPage**)&pPage, 0);
          if( rc==SQLITE_OK ){
            memcpy(pTo, sqlite3PagerGetData(pPage), szPage);
          }else{
            memset(pTo, 0, szPage);
          }
          sqlite3PagerUnref(pPage);
        }
      }
    }
  }
  sqlite3_finalize(pStmt);
  return pOut;
}